

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgsStreamReader.cpp
# Opt level: O2

int PGSStreamReader::calcFpsIndex(double fps)

{
  int i;
  long lVar1;
  undefined4 *puVar2;
  double *pdVar3;
  ulong uVar4;
  double dVar5;
  undefined1 *local_1a8;
  undefined8 local_1a0;
  undefined1 local_198;
  undefined7 uStack_197;
  undefined8 uStack_190;
  ostringstream ss;
  
  pdVar3 = pgs_frame_rates;
  lVar1 = 0;
  while( true ) {
    if (lVar1 == 0x10) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss);
      std::operator<<((ostream *)&ss,"Non standard fps value are not supported for PGS streams");
      puVar2 = (undefined4 *)__cxa_allocate_exception(0x28);
      std::__cxx11::stringbuf::str();
      *puVar2 = 3;
      *(undefined4 **)(puVar2 + 2) = puVar2 + 6;
      if (local_1a8 == &local_198) {
        *(ulong *)(puVar2 + 6) = CONCAT71(uStack_197,local_198);
        *(undefined8 *)(puVar2 + 8) = uStack_190;
      }
      else {
        *(undefined1 **)(puVar2 + 2) = local_1a8;
        *(ulong *)(puVar2 + 6) = CONCAT71(uStack_197,local_198);
      }
      *(undefined8 *)(puVar2 + 4) = local_1a0;
      local_198 = 0;
      __cxa_throw(puVar2,&VodCoreException::typeinfo,VodCoreException::~VodCoreException);
    }
    dVar5 = *pdVar3 - fps;
    uVar4 = -(ulong)(dVar5 < -dVar5);
    if ((double)(~uVar4 & (ulong)dVar5 | (ulong)-dVar5 & uVar4) < 0.0001) break;
    lVar1 = lVar1 + 1;
    pdVar3 = pdVar3 + 1;
  }
  return (int)lVar1;
}

Assistant:

int PGSStreamReader::calcFpsIndex(const double fps)
{
    for (int i = 0; i < 16; i++)
        if (fabs(pgs_frame_rates[i] - fps) < 1e-4)
            return i;
    THROW(ERR_COMMON, "Non standard fps value are not supported for PGS streams")
}